

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImFont::RenderText(ImFont *this,ImDrawList *draw_list,float size,ImVec2 *pos,ImU32 col,
                  ImVec4 *clip_rect,char *text_begin,char *text_end,float wrap_width,
                  bool cpu_fine_clip)

{
  uint *puVar1;
  float fVar2;
  char cVar3;
  ushort uVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  size_t sVar8;
  void *pvVar9;
  char *pcVar10;
  long lVar11;
  char *text;
  char *pcVar12;
  ImFontGlyph *pIVar13;
  ImDrawIdx IVar14;
  char *text_end_00;
  float scale;
  float fVar15;
  float fVar16;
  float fVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  uint c;
  uint local_90;
  ImU32 local_8c;
  undefined1 local_88 [16];
  ulong local_70;
  ImDrawIdx *local_68;
  ImDrawVert *local_60;
  uint local_54;
  int local_50;
  int local_4c;
  undefined1 local_48 [8];
  float fStack_40;
  float fStack_3c;
  char *local_38;
  
  local_8c = col;
  if (text_end == (char *)0x0) {
    sVar8 = strlen(text_begin);
    text_end = text_begin + sVar8;
  }
  fVar15 = (float)(int)pos->y;
  fVar21 = clip_rect->w;
  local_88 = ZEXT416((uint)fVar15);
  if (fVar15 <= fVar21) {
    scale = size / this->FontSize;
    fVar16 = this->FontSize * scale;
    _local_48 = ZEXT416((uint)pos->x);
    if (wrap_width <= 0.0) {
      fVar15 = fVar15 + fVar16;
      fVar17 = clip_rect->y;
      if ((fVar15 < fVar17) && (text_begin < text_end && fVar15 < fVar17)) {
        do {
          local_88 = ZEXT416((uint)fVar15);
          pvVar9 = memchr(text_begin,10,(long)text_end - (long)text_begin);
          text_begin = (char *)((long)pvVar9 + 1);
          if (pvVar9 == (void *)0x0) {
            text_begin = text_end;
          }
          fVar15 = fVar16 + (float)local_88._0_4_;
        } while ((fVar15 < fVar17) && (text_begin < text_end));
      }
    }
    text_end_00 = text_end;
    if ((wrap_width <= 0.0) && (10000 < (long)text_end - (long)text_begin)) {
      text_end_00 = text_begin;
      fVar15 = (float)local_88._0_4_;
      while ((fVar15 < fVar21 && (text_end_00 < text_end))) {
        pvVar9 = memchr(text_end_00,10,(long)text_end - (long)text_end_00);
        text_end_00 = (char *)((long)pvVar9 + 1);
        if (pvVar9 == (void *)0x0) {
          text_end_00 = text_end;
        }
        fVar15 = fVar15 + fVar16;
      }
    }
    if (text_begin != text_end_00) {
      local_48._4_4_ = (float)(int)(float)local_48._4_4_;
      local_48._0_4_ = (float)(int)(float)local_48._0_4_;
      fStack_40 = (float)(int)fStack_40;
      fStack_3c = (float)(int)fStack_3c;
      iVar7 = (int)text_end_00 - (int)text_begin;
      local_50 = iVar7 * 6;
      local_4c = (draw_list->IdxBuffer).Size;
      ImDrawList::PrimReserve(draw_list,local_50,iVar7 * 4);
      local_60 = draw_list->_VtxWritePtr;
      local_68 = draw_list->_IdxWritePtr;
      local_70 = (ulong)draw_list->_VtxCurrentIdx;
      local_54 = local_8c | 0xffffff;
      pcVar10 = (char *)0x0;
      fVar21 = (float)local_48._0_4_;
      fVar15 = (float)local_48._0_4_;
      do {
        if (text_end_00 <= text_begin) break;
        text = text_begin;
        fVar17 = (float)local_88._0_4_;
        uVar18 = local_88._4_4_;
        uVar19 = local_88._8_4_;
        uVar20 = local_88._12_4_;
        fVar22 = fVar21;
        local_38 = pcVar10;
        while (pcVar12 = local_38, 0.0 < wrap_width) {
          if (pcVar10 == (char *)0x0) {
            pcVar10 = CalcWordWrapPositionA
                                (this,scale,text,text_end_00,(fVar15 - fVar22) + wrap_width);
            uVar18 = 0;
            uVar19 = 0;
            uVar20 = 0;
            pcVar10 = pcVar10 + (pcVar10 == text);
            fVar15 = (float)local_48._0_4_;
          }
          if (text < pcVar10) {
            local_88._4_4_ = uVar18;
            local_88._0_4_ = fVar17;
            local_88._8_4_ = uVar19;
            local_88._12_4_ = uVar20;
            pcVar12 = pcVar10;
            text_begin = text;
            fVar21 = fVar22;
            break;
          }
          do {
            if (text_end_00 <= text) break;
            cVar3 = *text;
            text = text + ((byte)(cVar3 - 9U) < 2 || cVar3 == ' ');
          } while ((cVar3 == ' ') || (cVar3 == '\t'));
          fVar17 = fVar17 + fVar16;
          pcVar10 = (char *)0x0;
          fVar22 = fVar15;
          if (text_end_00 <= text) goto LAB_0016a7e2;
        }
        local_90 = (uint)*text_begin;
        if (*text_begin < '\0') {
          iVar7 = ImTextCharFromUtf8(&local_90,text_begin,text_end_00);
          text_begin = text_begin + iVar7;
          fVar15 = (float)local_48._0_4_;
          if (local_90 != 0) goto LAB_0016a4c4;
          bVar5 = true;
        }
        else {
          text_begin = text_begin + 1;
LAB_0016a4c4:
          if (local_90 < 0x20) {
            if (local_90 != 0xd) {
              if (local_90 == 10) {
                local_88._0_4_ = (float)local_88._0_4_ + fVar16;
                bVar5 = clip_rect->w <= (float)local_88._0_4_ &&
                        (float)local_88._0_4_ != clip_rect->w;
                fVar21 = fVar15;
                goto LAB_0016a7c7;
              }
              goto LAB_0016a4fd;
            }
          }
          else {
LAB_0016a4fd:
            if (((local_90 & 0xffff) < (uint)(this->IndexLookup).Size) &&
               (uVar4 = (this->IndexLookup).Data[(ushort)local_90], uVar4 != 0xffff)) {
              pIVar13 = (ImFontGlyph *)(&((this->Glyphs).Data)->field_0x0 + (uint)uVar4 * 0x28);
            }
            else {
              pIVar13 = this->FallbackGlyph;
            }
            if (pIVar13 != (ImFontGlyph *)0x0) {
              fVar17 = pIVar13->AdvanceX * scale;
              if (((undefined1  [40])*pIVar13 & (undefined1  [40])0x2) != (undefined1  [40])0x0) {
                fVar28 = pIVar13->X0 * scale + fVar21;
                fVar22 = clip_rect->z;
                bVar5 = true;
                if (fVar28 <= fVar22) {
                  fVar29 = pIVar13->X1 * scale + fVar21;
                  fVar2 = clip_rect->x;
                  if (fVar2 <= fVar29) {
                    fVar30 = pIVar13->Y0 * scale + (float)local_88._0_4_;
                    fVar25 = pIVar13->Y1 * scale + (float)local_88._0_4_;
                    fVar23 = pIVar13->U0;
                    fVar27 = pIVar13->V0;
                    fVar26 = pIVar13->U1;
                    fVar24 = pIVar13->V1;
                    if (cpu_fine_clip) {
                      if (fVar28 < fVar2) {
                        fVar23 = fVar23 + (fVar26 - fVar23) *
                                          (1.0 - (fVar29 - fVar2) / (fVar29 - fVar28));
                        fVar28 = fVar2;
                      }
                      fVar2 = clip_rect->y;
                      if (fVar30 < fVar2) {
                        fVar27 = fVar27 + (fVar24 - fVar27) *
                                          (1.0 - (fVar25 - fVar2) / (fVar25 - fVar30));
                        fVar30 = fVar2;
                      }
                      if (fVar22 < fVar29) {
                        fVar26 = (fVar26 - fVar23) * ((fVar22 - fVar28) / (fVar29 - fVar28)) +
                                 fVar23;
                        fVar29 = fVar22;
                      }
                      fVar22 = clip_rect->w;
                      if (fVar22 < fVar25) {
                        fVar24 = (fVar24 - fVar27) * ((fVar22 - fVar30) / (fVar25 - fVar30)) +
                                 fVar27;
                        fVar25 = fVar22;
                      }
                      if (fVar25 <= fVar30) {
                        fVar21 = fVar21 + fVar17;
                        bVar5 = false;
                        goto LAB_0016a7bc;
                      }
                    }
                    uVar6 = local_54;
                    if (((undefined1  [40])*pIVar13 & (undefined1  [40])0x1) ==
                        (undefined1  [40])0x0) {
                      uVar6 = local_8c;
                    }
                    IVar14 = (ImDrawIdx)local_70;
                    *local_68 = IVar14;
                    local_68[1] = IVar14 + 1;
                    local_68[2] = IVar14 + 2;
                    local_68[3] = IVar14;
                    local_68[4] = IVar14 + 2;
                    local_68[5] = IVar14 + 3;
                    (local_60->pos).x = fVar28;
                    (local_60->pos).y = fVar30;
                    local_60->col = uVar6;
                    (local_60->uv).x = fVar23;
                    (local_60->uv).y = fVar27;
                    local_60[1].pos.x = fVar29;
                    local_60[1].pos.y = fVar30;
                    local_60[1].col = uVar6;
                    local_60[1].uv.x = fVar26;
                    local_60[1].uv.y = fVar27;
                    local_60[2].pos.x = fVar29;
                    local_60[2].pos.y = fVar25;
                    local_60[2].col = uVar6;
                    local_60[2].uv.x = fVar26;
                    local_60[2].uv.y = fVar24;
                    local_60[3].pos.x = fVar28;
                    local_60[3].pos.y = fVar25;
                    local_60[3].col = uVar6;
                    local_60[3].uv.x = fVar23;
                    local_60[3].uv.y = fVar24;
                    local_60 = local_60 + 4;
                    local_70 = (ulong)((int)local_70 + 4);
                    local_68 = local_68 + 6;
                  }
                }
LAB_0016a7bc:
                if (!bVar5) goto LAB_0016a7c5;
              }
              fVar21 = fVar21 + fVar17;
            }
          }
LAB_0016a7c5:
          bVar5 = false;
        }
LAB_0016a7c7:
        pcVar10 = pcVar12;
      } while (!bVar5);
LAB_0016a7e2:
      (draw_list->VtxBuffer).Size =
           (int)((ulong)((long)local_60 - (long)(draw_list->VtxBuffer).Data) >> 2) * -0x33333333;
      iVar7 = (int)((ulong)((long)local_68 - (long)(draw_list->IdxBuffer).Data) >> 1);
      (draw_list->IdxBuffer).Size = iVar7;
      lVar11 = (long)(draw_list->CmdBuffer).Size;
      if (lVar11 < 1) {
        __assert_fail("i >= 0 && i < Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/imgui-src/imgui.h"
                      ,0x703,"T &ImVector<ImDrawCmd>::operator[](int) [T = ImDrawCmd]");
      }
      puVar1 = &(draw_list->CmdBuffer).Data[lVar11 + -1].ElemCount;
      *puVar1 = *puVar1 + (iVar7 - (local_4c + local_50));
      draw_list->_VtxWritePtr = local_60;
      draw_list->_IdxWritePtr = local_68;
      draw_list->_VtxCurrentIdx = (uint)local_70;
    }
  }
  return;
}

Assistant:

void ImFont::RenderText(ImDrawList* draw_list, float size, const ImVec2& pos, ImU32 col, const ImVec4& clip_rect, const char* text_begin, const char* text_end, float wrap_width, bool cpu_fine_clip) const
{
    if (!text_end)
        text_end = text_begin + strlen(text_begin); // ImGui:: functions generally already provides a valid text_end, so this is merely to handle direct calls.

    // Align to be pixel perfect
    float x = IM_FLOOR(pos.x);
    float y = IM_FLOOR(pos.y);
    if (y > clip_rect.w)
        return;

    const float start_x = x;
    const float scale = size / FontSize;
    const float line_height = FontSize * scale;
    const bool word_wrap_enabled = (wrap_width > 0.0f);
    const char* word_wrap_eol = NULL;

    // Fast-forward to first visible line
    const char* s = text_begin;
    if (y + line_height < clip_rect.y && !word_wrap_enabled)
        while (y + line_height < clip_rect.y && s < text_end)
        {
            s = (const char*)memchr(s, '\n', text_end - s);
            s = s ? s + 1 : text_end;
            y += line_height;
        }

    // For large text, scan for the last visible line in order to avoid over-reserving in the call to PrimReserve()
    // Note that very large horizontal line will still be affected by the issue (e.g. a one megabyte string buffer without a newline will likely crash atm)
    if (text_end - s > 10000 && !word_wrap_enabled)
    {
        const char* s_end = s;
        float y_end = y;
        while (y_end < clip_rect.w && s_end < text_end)
        {
            s_end = (const char*)memchr(s_end, '\n', text_end - s_end);
            s_end = s_end ? s_end + 1 : text_end;
            y_end += line_height;
        }
        text_end = s_end;
    }
    if (s == text_end)
        return;

    // Reserve vertices for remaining worse case (over-reserving is useful and easily amortized)
    const int vtx_count_max = (int)(text_end - s) * 4;
    const int idx_count_max = (int)(text_end - s) * 6;
    const int idx_expected_size = draw_list->IdxBuffer.Size + idx_count_max;
    draw_list->PrimReserve(idx_count_max, vtx_count_max);

    ImDrawVert* vtx_write = draw_list->_VtxWritePtr;
    ImDrawIdx* idx_write = draw_list->_IdxWritePtr;
    unsigned int vtx_current_idx = draw_list->_VtxCurrentIdx;

    const ImU32 col_untinted = col | ~IM_COL32_A_MASK;

    while (s < text_end)
    {
        if (word_wrap_enabled)
        {
            // Calculate how far we can render. Requires two passes on the string data but keeps the code simple and not intrusive for what's essentially an uncommon feature.
            if (!word_wrap_eol)
            {
                word_wrap_eol = CalcWordWrapPositionA(scale, s, text_end, wrap_width - (x - start_x));
                if (word_wrap_eol == s) // Wrap_width is too small to fit anything. Force displaying 1 character to minimize the height discontinuity.
                    word_wrap_eol++;    // +1 may not be a character start point in UTF-8 but it's ok because we use s >= word_wrap_eol below
            }

            if (s >= word_wrap_eol)
            {
                x = start_x;
                y += line_height;
                word_wrap_eol = NULL;

                // Wrapping skips upcoming blanks
                while (s < text_end)
                {
                    const char c = *s;
                    if (ImCharIsBlankA(c)) { s++; } else if (c == '\n') { s++; break; } else { break; }
                }
                continue;
            }
        }

        // Decode and advance source
        unsigned int c = (unsigned int)*s;
        if (c < 0x80)
        {
            s += 1;
        }
        else
        {
            s += ImTextCharFromUtf8(&c, s, text_end);
            if (c == 0) // Malformed UTF-8?
                break;
        }

        if (c < 32)
        {
            if (c == '\n')
            {
                x = start_x;
                y += line_height;
                if (y > clip_rect.w)
                    break; // break out of main loop
                continue;
            }
            if (c == '\r')
                continue;
        }

        const ImFontGlyph* glyph = FindGlyph((ImWchar)c);
        if (glyph == NULL)
            continue;

        float char_width = glyph->AdvanceX * scale;
        if (glyph->Visible)
        {
            // We don't do a second finer clipping test on the Y axis as we've already skipped anything before clip_rect.y and exit once we pass clip_rect.w
            float x1 = x + glyph->X0 * scale;
            float x2 = x + glyph->X1 * scale;
            float y1 = y + glyph->Y0 * scale;
            float y2 = y + glyph->Y1 * scale;
            if (x1 <= clip_rect.z && x2 >= clip_rect.x)
            {
                // Render a character
                float u1 = glyph->U0;
                float v1 = glyph->V0;
                float u2 = glyph->U1;
                float v2 = glyph->V1;

                // CPU side clipping used to fit text in their frame when the frame is too small. Only does clipping for axis aligned quads.
                if (cpu_fine_clip)
                {
                    if (x1 < clip_rect.x)
                    {
                        u1 = u1 + (1.0f - (x2 - clip_rect.x) / (x2 - x1)) * (u2 - u1);
                        x1 = clip_rect.x;
                    }
                    if (y1 < clip_rect.y)
                    {
                        v1 = v1 + (1.0f - (y2 - clip_rect.y) / (y2 - y1)) * (v2 - v1);
                        y1 = clip_rect.y;
                    }
                    if (x2 > clip_rect.z)
                    {
                        u2 = u1 + ((clip_rect.z - x1) / (x2 - x1)) * (u2 - u1);
                        x2 = clip_rect.z;
                    }
                    if (y2 > clip_rect.w)
                    {
                        v2 = v1 + ((clip_rect.w - y1) / (y2 - y1)) * (v2 - v1);
                        y2 = clip_rect.w;
                    }
                    if (y1 >= y2)
                    {
                        x += char_width;
                        continue;
                    }
                }

                // Support for untinted glyphs
                ImU32 glyph_col = glyph->Colored ? col_untinted : col;

                // We are NOT calling PrimRectUV() here because non-inlined causes too much overhead in a debug builds. Inlined here:
                {
                    idx_write[0] = (ImDrawIdx)(vtx_current_idx); idx_write[1] = (ImDrawIdx)(vtx_current_idx+1); idx_write[2] = (ImDrawIdx)(vtx_current_idx+2);
                    idx_write[3] = (ImDrawIdx)(vtx_current_idx); idx_write[4] = (ImDrawIdx)(vtx_current_idx+2); idx_write[5] = (ImDrawIdx)(vtx_current_idx+3);
                    vtx_write[0].pos.x = x1; vtx_write[0].pos.y = y1; vtx_write[0].col = glyph_col; vtx_write[0].uv.x = u1; vtx_write[0].uv.y = v1;
                    vtx_write[1].pos.x = x2; vtx_write[1].pos.y = y1; vtx_write[1].col = glyph_col; vtx_write[1].uv.x = u2; vtx_write[1].uv.y = v1;
                    vtx_write[2].pos.x = x2; vtx_write[2].pos.y = y2; vtx_write[2].col = glyph_col; vtx_write[2].uv.x = u2; vtx_write[2].uv.y = v2;
                    vtx_write[3].pos.x = x1; vtx_write[3].pos.y = y2; vtx_write[3].col = glyph_col; vtx_write[3].uv.x = u1; vtx_write[3].uv.y = v2;
                    vtx_write += 4;
                    vtx_current_idx += 4;
                    idx_write += 6;
                }
            }
        }
        x += char_width;
    }

    // Give back unused vertices (clipped ones, blanks) ~ this is essentially a PrimUnreserve() action.
    draw_list->VtxBuffer.Size = (int)(vtx_write - draw_list->VtxBuffer.Data); // Same as calling shrink()
    draw_list->IdxBuffer.Size = (int)(idx_write - draw_list->IdxBuffer.Data);
    draw_list->CmdBuffer[draw_list->CmdBuffer.Size - 1].ElemCount -= (idx_expected_size - draw_list->IdxBuffer.Size);
    draw_list->_VtxWritePtr = vtx_write;
    draw_list->_IdxWritePtr = idx_write;
    draw_list->_VtxCurrentIdx = vtx_current_idx;
}